

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O1

void __thiscall
xe::ContainerFormatParser::feed(ContainerFormatParser *this,deUint8 *bytes,size_t numBytes)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int count;
  
  iVar4 = (this->m_buf).m_numElements;
  iVar1 = (this->m_buf).m_size;
  count = (int)numBytes;
  if (iVar1 - iVar4 < count) {
    iVar1 = iVar1 * 2;
    uVar2 = iVar4 + count;
    if (uVar2 == 0) {
      bVar3 = 0;
    }
    else {
      iVar4 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      bVar3 = (byte)iVar4 ^ 0x1f;
    }
    iVar4 = 1 << ((((uVar2 & uVar2 - 1) != 0) - bVar3) + 0x1f & 0x1f);
    if (iVar4 < iVar1) {
      iVar4 = iVar1;
    }
    de::RingBuffer<unsigned_char>::resize(&this->m_buf,iVar4);
  }
  de::RingBuffer<unsigned_char>::pushFront(&this->m_buf,bytes,count);
  if (this->m_element != CONTAINERELEMENT_INCOMPLETE) {
    return;
  }
  advance(this);
  return;
}

Assistant:

void ContainerFormatParser::feed (const deUint8* bytes, size_t numBytes)
{
	// Grow buffer if necessary.
	if (m_buf.getNumFree() < (int)numBytes)
		m_buf.resize(getNextBufferSize(m_buf.getSize(), m_buf.getNumElements()+(int)numBytes));

	// Append to front.
	m_buf.pushFront(bytes, (int)numBytes);

	// If we haven't parsed complete element, re-try after data feed.
	if (m_element == CONTAINERELEMENT_INCOMPLETE)
		advance();
}